

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * google::protobuf::UnescapeCEscapeString(string *__return_storage_ptr__,string *src)

{
  int iVar1;
  char *dest;
  scoped_array<char> unescaped;
  scoped_array<char> local_20;
  
  dest = (char *)operator_new__(src->_M_string_length + 1);
  local_20.array_ = dest;
  iVar1 = UnescapeCEscapeSequences
                    ((src->_M_dataplus)._M_p,dest,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,dest,dest + iVar1);
  internal::scoped_array<char>::~scoped_array(&local_20);
  return __return_storage_ptr__;
}

Assistant:

string UnescapeCEscapeString(const string& src) {
  scoped_array<char> unescaped(new char[src.size() + 1]);
  int len = UnescapeCEscapeSequences(src.c_str(), unescaped.get(), NULL);
  return string(unescaped.get(), len);
}